

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-player.c
# Opt level: O0

void media_player2_player_skeleton_get_property
               (GObject *object,guint prop_id,GValue *value,GParamSpec *pspec)

{
  GType GVar1;
  long lVar2;
  MediaPlayer2PlayerSkeleton *skeleton;
  GParamSpec *pspec_local;
  GValue *value_local;
  guint prop_id_local;
  GObject *object_local;
  
  GVar1 = media_player2_player_skeleton_get_type();
  lVar2 = g_type_check_instance_cast(object,GVar1);
  if ((prop_id == 0) || (0xe < prop_id - 1)) {
    g_assertion_message_expr
              (0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/f1u77y[P]headphones-plug-detector/build_O0/mpris-generated/mpris-player.c"
               ,0xed2,"media_player2_player_skeleton_get_property",
               "prop_id != 0 && prop_id - 1 < 15");
  }
  g_mutex_lock(*(long *)(lVar2 + 0x20) + 0x20);
  g_value_copy(**(long **)(lVar2 + 0x20) + (ulong)(prop_id - 1) * 0x18,value);
  g_mutex_unlock(*(long *)(lVar2 + 0x20) + 0x20);
  return;
}

Assistant:

static void
media_player2_player_skeleton_get_property (GObject      *object,
  guint         prop_id,
  GValue       *value,
  GParamSpec   *pspec G_GNUC_UNUSED)
{
  MediaPlayer2PlayerSkeleton *skeleton = MEDIA_PLAYER2_PLAYER_SKELETON (object);
  g_assert (prop_id != 0 && prop_id - 1 < 15);
  g_mutex_lock (&skeleton->priv->lock);
  g_value_copy (&skeleton->priv->properties[prop_id - 1], value);
  g_mutex_unlock (&skeleton->priv->lock);
}